

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O1

void diy::
     Serialization<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>::
     load(BinaryBuffer *bb,Vector *v)

{
  size_t s;
  size_type local_30;
  value_type local_28;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&local_30,8);
  local_28.super_array<float,_3UL>._M_elems[2] = 0.0;
  local_28.super_array<float,_3UL>._M_elems[0] = 0.0;
  local_28.super_array<float,_3UL>._M_elems[1] = 0.0;
  Catch::clara::std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::resize
            (v,local_30,&local_28);
  if (local_30 != 0) {
    (*bb->_vptr_BinaryBuffer[4])
              (bb,(v->
                  super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                  )._M_impl.super__Vector_impl_data._M_start,local_30 * 0xc);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }